

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srt.c
# Opt level: O3

void srt_dump(srt_t *srt)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  vtt_block_t *pvVar9;
  double dVar10;
  
  pvVar9 = srt->cue_head;
  if (pvVar9 != (vtt_block_t *)0x0) {
    uVar8 = 1;
    do {
      dVar1 = pvVar9->timestamp;
      auVar2 = SEXT816((long)(dVar1 * 1000.0)) * SEXT816(0x20c49ba5e353f7cf);
      auVar4 = SEXT816((long)dVar1) * ZEXT816(0x8888888888888889);
      auVar5 = SEXT816((long)(dVar1 / 60.0)) * ZEXT816(0x8888888888888889);
      dVar10 = dVar1 + pvVar9->duration;
      auVar3 = SEXT816((long)(dVar10 * 1000.0)) * SEXT816(0x20c49ba5e353f7cf);
      auVar6 = SEXT816((long)dVar10) * ZEXT816(0x8888888888888889);
      auVar7 = SEXT816((long)(dVar10 / 60.0)) * ZEXT816(0x8888888888888889);
      printf("%02d\r\n%d:%02d:%02d,%03d --> %02d:%02d:%02d,%03d\r\n%s\r\n",(ulong)uVar8,
             (long)(dVar1 / 3600.0) & 0xffffffff,
             (ulong)(uint)((int)(long)(dVar1 / 60.0) +
                          ((int)(auVar5._8_8_ >> 5) - (auVar5._12_4_ >> 0x1f)) * -0x3c),
             (ulong)(uint)((int)(long)dVar1 +
                          ((int)(auVar4._8_8_ >> 5) - (auVar4._12_4_ >> 0x1f)) * -0x3c),
             (ulong)(uint)((int)(long)(dVar1 * 1000.0) +
                          ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) * -1000),
             (long)(dVar10 / 3600.0),
             (ulong)(uint)((int)(long)(dVar10 / 60.0) +
                          ((int)(auVar7._8_8_ >> 5) - (auVar7._12_4_ >> 0x1f)) * -0x3c),
             (ulong)(uint)((int)(long)dVar10 +
                          ((int)(auVar6._8_8_ >> 5) - (auVar6._12_4_ >> 0x1f)) * -0x3c),
             (ulong)(uint)((int)(long)(dVar10 * 1000.0) +
                          ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) * -1000),pvVar9 + 1);
      uVar8 = uVar8 + 1;
      pvVar9 = pvVar9->next;
    } while (pvVar9 != (_vtt_block_t *)0x0);
  }
  return;
}

Assistant:

void srt_dump(srt_t* srt)
{
    int i;
    vtt_block_t* block;

    for (block = srt->cue_head, i = 1; block; block = block->next, ++i) {
        int hh1, hh2, mm1, mm2, ss1, ss2, ms1, ms2;
        vtt_crack_time(block->timestamp, &hh1, &mm1, &ss1, &ms1);
        vtt_crack_time(block->timestamp + block->duration, &hh2, &mm2, &ss2, &ms2);

        printf("%02d\r\n%d:%02d:%02d,%03d --> %02d:%02d:%02d,%03d\r\n%s\r\n", i,
            hh1, mm1, ss1, ms1, hh2, mm2, ss2, ms2, vtt_block_data(block));
    }
}